

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O2

OutputBox * __thiscall OutputBox::operator=(OutputBox *this,OutputBox *param_1)

{
  this->bar_width_ = param_1->bar_width_;
  std::__cxx11::string::operator=((string *)&this->title_,(string *)&param_1->title_);
  this->pre_spaces_ = param_1->pre_spaces_;
  ProgressBar::operator=(&this->pb,&param_1->pb);
  return this;
}

Assistant:

OutputBox(const std::string& title = "", 
        const unsigned bar_width = CONSOLE_WIDTH, 
        const unsigned pre_spaces = 2)
    {
        pre_spaces_ = pre_spaces;
        bar_width_ = bar_width > CONSOLE_WIDTH ? CONSOLE_WIDTH : bar_width;
        bar_width_ -= pre_spaces_;

        if (title.size() > bar_width_ - 4) {
            title_ = title.substr(0, bar_width_ - 4 - 3) + "...";
        }
        else {
            title_ = title;
        }
        //transform(title_.begin(), title_.end(), title_.begin(), ::toupper);

        if (title_ != "") {
            dmux::cout << "\n";
            PrintSeparatorLine();
            PrintData(title_);
            PrintSeparatorLine();
        }
    }